

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

void __thiscall
pbrt::ParameterDictionary::ParameterDictionary
          (ParameterDictionary *this,ParsedParameterVector *p,RGBColorSpace *colorSpace)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  ParsedParameter *pPVar3;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&this->params,p);
  this->colorSpace = colorSpace;
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar4 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar4 = paVar1;
  }
  if ((sVar2 != 0) && (puVar6 = (undefined8 *)((long)paVar4 + sVar2 * 8 + -8), paVar4 < puVar6)) {
    do {
      puVar5 = (undefined8 *)((long)paVar4 + 8);
      pPVar3 = paVar4->fixed[0];
      paVar4->fixed[0] = (ParsedParameter *)*puVar6;
      *puVar6 = pPVar3;
      puVar6 = puVar6 + -1;
      paVar4 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                *)puVar5;
    } while (puVar5 < puVar6);
  }
  if (colorSpace == (RGBColorSpace *)0x0) {
    LogFatal<char_const(&)[22]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/paramdict.cpp"
               ,0xa1,"Check failed: %s",(char (*) [22])0x56d65e);
  }
  checkParameterTypes(this);
  return;
}

Assistant:

ParameterDictionary::ParameterDictionary(ParsedParameterVector p,
                                         const RGBColorSpace *colorSpace)
    : params(std::move(p)), colorSpace(colorSpace) {
    std::reverse(params.begin(), params.end());
    CHECK(colorSpace != nullptr);
    checkParameterTypes();
}